

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O2

void __thiscall libtorrent::session::abort(session *this)

{
  long in_RSI;
  __shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2> _Stack_78;
  __shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2> local_68;
  __shared_ptr<boost::asio::io_context,_(__gnu_cxx::_Lock_policy)2> local_58;
  _Any_data local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  
  local_38 = 0;
  uStack_30 = 0;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  aux::alert_manager::set_notify_function
            ((alert_manager *)(*(long *)(in_RSI + 0x30) + 0x1048),(function<void_()> *)&local_48);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_48);
  ::std::__shared_ptr<boost::asio::io_context,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_58,
             (__shared_ptr<boost::asio::io_context,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 0x10));
  ::std::__shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_68,(__shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 0x20));
  ::std::__shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_78,
             (__shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2> *)
             (in_RSI + 0x30));
  session_proxy::session_proxy
            ((session_proxy *)this,(shared_ptr<boost::asio::io_context> *)&local_58,
             (shared_ptr<std::thread> *)&local_68,
             (shared_ptr<libtorrent::aux::session_impl> *)&_Stack_78);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_78._M_refcount);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  return;
}

Assistant:

session_proxy session::abort()
	{
		// stop calling the alert notify function now, to avoid it thinking the
		// session is still alive
		m_impl->alerts().set_notify_function({});
		return session_proxy(m_io_service, m_thread, m_impl);
	}